

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O3

void __thiscall Assimp::LWS::Element::~Element(Element *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  
  std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::_M_clear
            (&(this->children).
              super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
  paVar2 = &this->tokens[1].field_2;
  lVar3 = -0x40;
  do {
    pcVar1 = (((string *)(paVar2 + -1))->_M_dataplus)._M_p;
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar1) {
      operator_delete(pcVar1);
    }
    paVar2 = paVar2 + -2;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return;
}

Assistant:

Element()
    {}